

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int32 *
ma_dr_flac_open_memory_and_read_pcm_frames_s32
          (void *data,size_t dataSize,uint *channels,uint *sampleRate,ma_uint64 *totalPCMFrameCount,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac *pmVar1;
  ma_allocation_callbacks *in_RCX;
  undefined4 *in_RDX;
  void *in_RSI;
  undefined8 *in_R8;
  ma_dr_flac *pFlac;
  ma_uint64 *in_stack_00003ff0;
  uint *in_stack_00003ff8;
  uint *in_stack_00004000;
  ma_dr_flac *in_stack_00004008;
  ma_int32 *local_8;
  
  if (in_RCX != (ma_allocation_callbacks *)0x0) {
    *(undefined4 *)&in_RCX->pUserData = 0;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  pmVar1 = ma_dr_flac_open_memory(in_RSI,(size_t)in_RDX,in_RCX);
  if (pmVar1 == (ma_dr_flac *)0x0) {
    local_8 = (ma_int32 *)0x0;
  }
  else {
    local_8 = ma_dr_flac__full_read_and_close_s32
                        (in_stack_00004008,in_stack_00004000,in_stack_00003ff8,in_stack_00003ff0);
  }
  return local_8;
}

Assistant:

MA_API ma_int32* ma_dr_flac_open_memory_and_read_pcm_frames_s32(const void* data, size_t dataSize, unsigned int* channels, unsigned int* sampleRate, ma_uint64* totalPCMFrameCount, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (sampleRate) {
        *sampleRate = 0;
    }
    if (channels) {
        *channels = 0;
    }
    if (totalPCMFrameCount) {
        *totalPCMFrameCount = 0;
    }
    pFlac = ma_dr_flac_open_memory(data, dataSize, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s32(pFlac, channels, sampleRate, totalPCMFrameCount);
}